

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::EndTestCase
          (XmlReporter *this,TestCaseInfo *param_1,Totals *param_2,string *param_3,string *param_4)

{
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [16];
  string *param_4_local;
  string *param_3_local;
  Totals *param_2_local;
  TestCaseInfo *param_1_local;
  XmlReporter *this_local;
  
  local_38._8_8_ = param_4;
  param_4_local = param_3;
  param_3_local = (string *)param_2;
  param_2_local = (Totals *)param_1;
  param_1_local = (TestCaseInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"OverallResult",&local_59);
  XmlWriter::scopedElement((XmlWriter *)local_38,(string *)&this->m_xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"success",&local_91);
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)local_38,(string *)local_90,&this->m_currentTestSuccess);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string&, const std::string& ) {
            m_xml.scopedElement( "OverallResult" ).writeAttribute( "success", m_currentTestSuccess );
            m_xml.endElement();
        }